

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

void xmlSchematronFreeParserCtxt(xmlSchematronParserCtxtPtr ctxt)

{
  if (ctxt != (xmlSchematronParserCtxtPtr)0x0) {
    if ((ctxt->doc != (xmlDocPtr)0x0) && (ctxt->preserve == 0)) {
      xmlFreeDoc(ctxt->doc);
    }
    if (ctxt->xctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xctxt);
    }
    if (ctxt->namespaces != (xmlChar **)0x0) {
      (*xmlFree)(ctxt->namespaces);
    }
    xmlDictFree(ctxt->dict);
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlSchematronFreeParserCtxt(xmlSchematronParserCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->doc != NULL && !ctxt->preserve)
        xmlFreeDoc(ctxt->doc);
    if (ctxt->xctxt != NULL) {
        xmlXPathFreeContext(ctxt->xctxt);
    }
    if (ctxt->namespaces != NULL)
        xmlFree((char **) ctxt->namespaces);
    xmlDictFree(ctxt->dict);
    xmlFree(ctxt);
}